

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

shared_ptr<SchemeObject> evaluate_string_in_global_context(string *s)

{
  bool bVar1;
  ostream *poVar2;
  element_type *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  shared_ptr<SchemeObject> sVar3;
  eval_error *e;
  undefined1 local_230 [72];
  int local_1e8;
  undefined1 local_1e1;
  int expression_index;
  ParseResult parsed;
  istringstream local_198 [8];
  istringstream is;
  string *s_local;
  shared_ptr<SchemeObject> *object;
  
  std::__cxx11::istringstream::istringstream(local_198);
  std::__cxx11::istringstream::str((string *)local_198);
  ParseResult::ParseResult((ParseResult *)&expression_index);
  local_1e1 = 0;
  std::shared_ptr<SchemeObject>::shared_ptr((shared_ptr<SchemeObject> *)s,(nullptr_t)0x0);
  local_1e8 = 0;
  while( true ) {
    local_1e8 = local_1e8 + 1;
    read_object((ParseResult *)(local_230 + 0x10),(istream *)local_198);
    ParseResult::operator=((ParseResult *)&expression_index,(ParseResult *)(local_230 + 0x10));
    ParseResult::~ParseResult((ParseResult *)(local_230 + 0x10));
    if (expression_index == 2) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)s);
      if (bVar1) {
        local_1e1 = 1;
        ParseResult::~ParseResult((ParseResult *)&expression_index);
        std::__cxx11::istringstream::~istringstream(local_198);
        sVar3.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             extraout_RDX._M_pi;
        sVar3.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)s;
        return (shared_ptr<SchemeObject>)
               sVar3.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"FAILED\nNothing to execute");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    if (expression_index == 1) break;
    this = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &parsed);
    ASTNode::evaluate((ExecutionResult *)&e,this,&global_context);
    ExecutionResult::force_value((ExecutionResult *)local_230);
    std::shared_ptr<SchemeObject>::operator=
              ((shared_ptr<SchemeObject> *)s,(shared_ptr<SchemeObject> *)local_230);
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)local_230);
    ExecutionResult::~ExecutionResult((ExecutionResult *)&e);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"FAILED\nCould not parse expression ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1e8);
  poVar2 = std::operator<<(poVar2," in ");
  poVar2 = std::operator<<(poVar2,in_RSI);
  poVar2 = std::operator<<(poVar2,": ");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &parsed.node.
                                   super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

static std::shared_ptr<SchemeObject> evaluate_string_in_global_context(const std::string &s)
{
    std::istringstream is;
    is.str(s);
    ParseResult parsed;
    std::shared_ptr<SchemeObject> object{nullptr};
    int expression_index = 0;
    while(true)
    {
        ++expression_index;
        parsed = read_object(is);
        if(parsed.result == parse_result_t::END)
        {
            if(!object)
            {
                std::cout << "FAILED\nNothing to execute" << std::endl;
                exit(1);
            }
            break;
        }
        if(parsed.result == parse_result_t::ERROR)
        {
            std::cout << "FAILED\nCould not parse expression " << expression_index << " in " << s << ": "
                      << parsed.error << std::endl;
            exit(1);
        }
        try
        {
            object = parsed.node->evaluate(global_context).force_value();
        }
        catch(eval_error &e)
        {
            std::cout << "FAILED\nCould not evaluate expression " << expression_index << " in " << s << ": "
                      << e.what() << std::endl;
            exit(1);
        }
    }
    return object;
}